

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::build_tree
          (compiler_type *this,tree_type<cs::token_base_*> *tree,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *signals,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *objects)

{
  _Elt_pointer pptVar1;
  _func_int **pp_Var2;
  tree_type<cs::token_base_*> *ptVar3;
  _Map_pointer it_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  size_type sVar8;
  token_base *ptVar9;
  undefined4 extraout_var;
  iterator iVar10;
  reference pptVar11;
  token_base **pptVar12;
  compile_error *this_00;
  _Elt_pointer pptVar13;
  token_base **it;
  _Elt_pointer pptVar14;
  tree_type<cs::token_base_*> *__x;
  tree_type<cs::token_base_*> *ptVar15;
  tree_type<cs::token_base_*> *ptVar16;
  _func_int *p_Var17;
  size_t i;
  ulong __n;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *list;
  _func_int **pp_Var18;
  tree_type<cs::token_base_*> t;
  _Map_pointer local_d8;
  size_t local_d0;
  _func_int **local_c0;
  tree_type<cs::token_base_*> local_88;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  
  if (((objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_cur !=
       (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur) &&
     ((signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_start._M_cur)) {
    ptVar16 = tree;
    sVar7 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size(objects);
    sVar8 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size(signals);
    if (sVar7 == sVar8 + 1) {
      pptVar14 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar13 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_last;
      local_d8 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      pptVar1 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (pptVar14 != pptVar1) {
        if ((*pptVar14 != (token_base *)0x0) &&
           (iVar5 = (*(*pptVar14)->_vptr_token_base[2])(), iVar5 == 9)) {
          ptVar9 = *pptVar14;
          std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
                    ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&tokens);
          pp_Var18 = ptVar9[2]._vptr_token_base;
          local_c0 = ptVar9[3]._vptr_token_base;
          local_d0 = ptVar9[3].line_num;
          pp_Var2 = ptVar9[4]._vptr_token_base;
          while (pp_Var18 != pp_Var2) {
            __x = (tree_type<cs::token_base_*> *)pp_Var18[2];
            ptVar15 = (tree_type<cs::token_base_*> *)pp_Var18[4];
            p_Var17 = pp_Var18[5];
            ptVar3 = (tree_type<cs::token_base_*> *)pp_Var18[6];
            while (__x != ptVar3) {
              ptVar16 = __x;
              std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                        (&tokens,(value_type *)__x);
              __x = __x + 1;
              if (__x == ptVar15) {
                __x = *(tree_type<cs::token_base_*> **)(p_Var17 + 8);
                p_Var17 = p_Var17 + 8;
                ptVar15 = __x + 0x40;
              }
            }
            t.mRoot = (tree_node *)token_base::operator_new((token_base *)0x18,(size_t)ptVar16);
            (t.mRoot)->left = (tree_node *)0x1;
            (t.mRoot)->root = (tree_node *)&PTR__token_base_00248ed0;
            *(undefined4 *)&(t.mRoot)->right = 0xd;
            ptVar16 = &t;
            std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
            emplace_back<cs::token_base*>
                      ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)&tokens,
                       (token_base **)ptVar16);
            pp_Var18 = pp_Var18 + 10;
            if (pp_Var18 == local_c0) {
              pp_Var18 = *(_func_int ***)(local_d0 + 8);
              local_d0 = local_d0 + 8;
              local_c0 = pp_Var18 + 0x3c;
            }
          }
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::pop_back(&tokens);
          t.mRoot = (tree_node *)0x0;
          ptVar16 = &t;
          gen_tree(this,ptVar16,&tokens);
          ptVar9 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)ptVar16);
          ptVar16 = (tree_type<cs::token_base_*> *)0x0;
          iVar5 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)t.mRoot,(EVP_PKEY_CTX *)0x0);
          ptVar9->line_num = 1;
          ptVar9->_vptr_token_base = (_func_int **)&PTR__token_expr_00248fc0;
          ptVar9[1]._vptr_token_base = (_func_int **)CONCAT44(extraout_var,iVar5);
          local_88.mRoot = (tree_node *)0x0;
          *pptVar14 = ptVar9;
          tree_type<cs::token_base_*>::~tree_type(&local_88);
          tree_type<cs::token_base_*>::~tree_type(&t);
          std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                    ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&tokens);
        }
        pptVar14 = pptVar14 + 1;
        if (pptVar14 == pptVar13) {
          pptVar14 = local_d8[1];
          local_d8 = local_d8 + 1;
          pptVar13 = pptVar14 + 0x40;
        }
      }
      tree_type<cs::token_base_*>::clear(tree);
      tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
                ((tree_type<cs::token_base*> *)tree,tree->mRoot,
                 (signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_cur);
      tree_type<cs::token_base*>::emplace_left_left<cs::token_base*&>
                ((tree_type<cs::token_base*> *)tree,tree->mRoot,
                 (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_cur);
      __n = 1;
      do {
        sVar7 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size(signals);
        if (sVar7 <= __n) {
          tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
          super__Deque_impl_data._M_map = (_Map_pointer)tree->mRoot;
          while( true ) {
            if ((tree_node *)
                tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>.
                _M_impl.super__Deque_impl_data._M_map == (tree_node *)0x0) {
              return;
            }
            iVar10 = tree_type<cs::token_base_*>::iterator::right((iterator *)&tokens);
            if (iVar10.mData == (tree_node *)0x0) break;
            tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
            super__Deque_impl_data._M_map =
                 (_Map_pointer)tree_type<cs::token_base_*>::iterator::right((iterator *)&tokens);
          }
          pptVar13 = (objects->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_finish._M_cur;
          if (pptVar13 ==
              (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_first) {
            pptVar13 = (objects->
                       super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                       _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          tree_type<cs::token_base*>::emplace_right_right<cs::token_base*&>
                    ((tree_type<cs::token_base*> *)tree,
                     (iterator)
                     tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>.
                     _M_impl.super__Deque_impl_data._M_map,pptVar13 + -1);
          return;
        }
        tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)tree->mRoot;
        while ((tree_node *)
               tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl
               .super__Deque_impl_data._M_map != (tree_node *)0x0) {
          iVar10 = tree_type<cs::token_base_*>::iterator::right((iterator *)&tokens);
          it_00 = tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_map;
          if (iVar10.mData == (tree_node *)0x0) {
            pptVar11 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                 (objects,__n);
            tree_type<cs::token_base*>::emplace_right_right<cs::token_base*&>
                      ((tree_type<cs::token_base*> *)tree,(iterator)it_00,pptVar11);
            break;
          }
          tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
          super__Deque_impl_data._M_map =
               (_Map_pointer)tree_type<cs::token_base_*>::iterator::right((iterator *)&tokens);
        }
        tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)tree->mRoot;
        while ((tree_node *)
               tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl
               .super__Deque_impl_data._M_map != (tree_node *)0x0) {
          iVar10 = tree_type<cs::token_base_*>::iterator::right((iterator *)&tokens);
          if (iVar10.mData == (tree_node *)0x0) {
LAB_0014f4f2:
            iVar10.mData = (tree_node *)
                           tokens.
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>.
                           _M_impl.super__Deque_impl_data._M_map;
            pptVar12 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                 (signals,__n);
LAB_0014f504:
            tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
                      ((tree_type<cs::token_base*> *)tree,iVar10,pptVar12);
            break;
          }
          pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&tokens);
          iVar5 = get_signal_level(this,*pptVar12);
          pptVar11 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                               (signals,__n);
          iVar6 = get_signal_level(this,*pptVar11);
          pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&tokens);
          if (iVar5 == iVar6) {
            bVar4 = is_left_associative(this,*pptVar12);
            iVar10.mData = (tree_node *)
                           tokens.
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>.
                           _M_impl.super__Deque_impl_data._M_map;
            pptVar12 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                 (signals,__n);
            if (!bVar4) goto LAB_0014f504;
            tree_type<cs::token_base*>::emplace_right_left<cs::token_base*&>
                      ((tree_type<cs::token_base*> *)tree,iVar10,pptVar12);
            break;
          }
          iVar5 = get_signal_level(this,*pptVar12);
          pptVar11 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                               (signals,__n);
          iVar6 = get_signal_level(this,*pptVar11);
          if (iVar6 < iVar5) goto LAB_0014f4f2;
          tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
          super__Deque_impl_data._M_map =
               (_Map_pointer)tree_type<cs::token_base_*>::iterator::right((iterator *)&tokens);
        }
        __n = __n + 1;
      } while( true );
    }
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&tokens,"Unexpected grammar when building expression tree.",(allocator *)&t);
  compile_error::compile_error(this_00,(string *)&tokens);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

void compiler_type::build_tree(tree_type<token_base *> &tree, std::deque<token_base *> &signals,
	                               std::deque<token_base *> &objects)
	{
		if (objects.empty() || signals.empty() || objects.size() != signals.size() + 1)
			throw compile_error("Unexpected grammar when building expression tree.");
		for (auto &obj: objects) {
			if (obj != nullptr && obj->get_type() == token_types::sblist) {
				auto *sbl = static_cast<token_sblist *>(obj);
				std::deque<token_base *> tokens;
				for (auto &list: sbl->get_list()) {
					for (auto &it: list)
						tokens.push_back(it);
					tokens.push_back(new token_signal(signal_types::com_));
				}
				tokens.pop_back();
				tree_type<token_base *> t;
				gen_tree(t, tokens);
				obj = new token_expr(t);
			}
		}
		tree.clear();
		tree.emplace_root_left(tree.root(), signals.front());
		tree.emplace_left_left(tree.root(), objects.front());
		for (std::size_t i = 1; i < signals.size(); ++i) {
			for (typename tree_type<token_base *>::iterator it = tree.root(); it.usable(); it = it.right()) {
				if (!it.right().usable()) {
					tree.emplace_right_right(it, objects.at(i));
					break;
				}
			}
			for (typename tree_type<token_base *>::iterator it = tree.root(); it.usable(); it = it.right()) {
				if (!it.right().usable()) {
					tree.emplace_root_left(it, signals.at(i));
					break;
				}
				if (get_signal_level(it.data()) == get_signal_level(signals.at(i))) {
					if (is_left_associative(it.data()))
						tree.emplace_right_left(it, signals.at(i));
					else
						tree.emplace_root_left(it, signals.at(i));
					break;
				}
				if (get_signal_level(it.data()) > get_signal_level(signals.at(i))) {
					tree.emplace_root_left(it, signals.at(i));
					break;
				}
			}
		}
		for (typename tree_type<token_base *>::iterator it = tree.root(); it.usable(); it = it.right()) {
			if (!it.right().usable()) {
				tree.emplace_right_right(it, objects.back());
				break;
			}
		}
	}